

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O2

spv_result_t spvtools::val::CapabilityPass(ValidationState_t *_,Instruction *inst)

{
  uint capability;
  spv_target_env sVar1;
  pointer psVar2;
  pointer puVar3;
  bool bVar4;
  spv_result_t sVar5;
  char *pcVar6;
  ulong uVar7;
  anon_class_16_2_ec1f0190 capability_str;
  string local_248;
  string opencl_profile;
  DiagnosticStream local_208;
  
  if ((inst->inst_).opcode != 0x11) {
    return SPV_SUCCESS;
  }
  psVar2 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(inst->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)psVar2 != 0x10) {
    __assert_fail("inst->operands().size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x124,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  if (psVar2->num_words != 1) {
    __assert_fail("operand.num_words == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x128,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
      (ulong)psVar2->offset) {
    __assert_fail("operand.offset < inst->words().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x129,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  capability = puVar3[psVar2->offset];
  uVar7 = (ulong)capability;
  sVar1 = _->context_->target_env;
  if ((sVar1 < SPV_ENV_UNIVERSAL_1_3) &&
     ((0x1d000U >> (sVar1 & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) != 0)) {
    pcVar6 = "Embedded";
    bVar4 = true;
  }
  else {
    pcVar6 = "Full";
    bVar4 = false;
  }
  capability_str._ = _;
  capability_str.capability = capability;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&opencl_profile,pcVar6,(allocator<char> *)&local_208);
  if (sVar1 == SPV_ENV_VULKAN_1_2) {
    sVar5 = SPV_SUCCESS;
    if ((((((capability < 0x34) && ((0xcd90000000003U >> (uVar7 & 0x3f) & 1) != 0)) ||
          (uVar7 == 0x14b5)) ||
         ((((capability - 0x1155 & 0xfffffffd) == 0 ||
           (bVar4 = anon_unknown_2::IsSupportOptionalVulkan_1_1(capability), bVar4)) ||
          ((capability - 0x14b6 < 0x2e &&
           ((0x3800000007fdU >> ((ulong)(capability - 0x14b6) & 0x3f) & 1) != 0)))))) ||
        ((capability - 0x1160 < 0x15 && ((0x1f0007U >> (capability - 0x1160 & 0x1f) & 1) != 0)))) ||
       ((capability - 0x45 < 2 ||
        (bVar4 = anon_unknown_2::IsEnabledByExtension(_,capability), bVar4)))) goto LAB_00192255;
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
    std::operator<<((ostream *)&local_208,"Capability ");
    CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
    operator()[abi_cxx11_(&local_248,&capability_str);
    std::operator<<((ostream *)&local_208,(string *)&local_248);
    pcVar6 = " is not allowed by Vulkan 1.2 specification";
LAB_00192203:
    std::operator<<((ostream *)&local_208,pcVar6);
    pcVar6 = " (or requires extension)";
  }
  else {
    if (sVar1 == SPV_ENV_VULKAN_1_1) {
      sVar5 = SPV_SUCCESS;
      if ((((capability < 0x34) && ((0xcd90000000003U >> (uVar7 & 0x3f) & 1) != 0)) ||
          ((capability - 0x1155 & 0xfffffffd) == 0)) ||
         ((bVar4 = anon_unknown_2::IsSupportOptionalVulkan_1_1(capability), bVar4 ||
          (bVar4 = anon_unknown_2::IsEnabledByExtension(_,capability), bVar4)))) goto LAB_00192255;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      std::operator<<((ostream *)&local_208,"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_248,&capability_str);
      std::operator<<((ostream *)&local_208,(string *)&local_248);
      pcVar6 = " is not allowed by Vulkan 1.1 specification";
      goto LAB_00192203;
    }
    if (sVar1 == SPV_ENV_VULKAN_1_0) {
      if (((capability < 0x3a) && ((0x3ffff8ffbc01e0fU >> (uVar7 & 0x3f) & 1) != 0)) ||
         (bVar4 = anon_unknown_2::IsEnabledByExtension(_,capability), bVar4)) {
        sVar5 = SPV_SUCCESS;
        goto LAB_00192255;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      std::operator<<((ostream *)&local_208,"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_248,&capability_str);
      std::operator<<((ostream *)&local_208,(string *)&local_248);
      pcVar6 = " is not allowed by Vulkan 1.0 specification";
      goto LAB_00192203;
    }
    sVar5 = SPV_SUCCESS;
    if (sVar1 - SPV_ENV_OPENCL_1_2 < 2) {
      if ((((capability < 0x28) &&
           (((0x80004025f0U >> (uVar7 & 0x3f) & 1) != 0 || ((uVar7 == 0xb && (!bVar4)))))) ||
          (bVar4 = anon_unknown_2::IsEnabledByExtension(_,capability), bVar4)) ||
         (((bVar4 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityImageBasic), bVar4 &&
           (capability < 0x30)) && ((0xd80000100000U >> (uVar7 & 0x3f) & 1) != 0))))
      goto LAB_00192255;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      std::operator<<((ostream *)&local_208,"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_248,&capability_str);
      std::operator<<((ostream *)&local_208,(string *)&local_248);
      pcVar6 = " is not allowed by OpenCL 1.2 ";
    }
    else {
      if (SPV_ENV_OPENCL_EMBEDDED_2_2 < sVar1) goto LAB_00192255;
      if ((0xe008U >> (sVar1 & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) == 0) {
        if ((0x10010U >> (sVar1 & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) == 0)
        goto LAB_00192255;
        if (capability < 0x28) {
          if ((0xc0004e01f0U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00192255;
          if (uVar7 != 0xb) goto LAB_00192280;
          if (!bVar4) goto LAB_00192255;
        }
        else {
LAB_00192280:
          if ((((capability - 0x3a & 0xfffffffd) == 0) || (uVar7 == 10)) || (capability == 0xd))
          goto LAB_00192255;
        }
        bVar4 = anon_unknown_2::IsEnabledByExtension(_,capability);
        if ((bVar4) ||
           (bVar4 = anon_unknown_2::IsEnabledByCapabilityOpenCL_2_0(_,capability), bVar4))
        goto LAB_00192255;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
        std::operator<<((ostream *)&local_208,"Capability ");
        CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
        operator()[abi_cxx11_(&local_248,&capability_str);
        std::operator<<((ostream *)&local_208,(string *)&local_248);
        pcVar6 = " is not allowed by OpenCL 2.2 ";
      }
      else {
        if (((capability < 0x28) &&
            (((0xc0004e25f0U >> (uVar7 & 0x3f) & 1) != 0 || ((uVar7 == 0xb && (!bVar4)))))) ||
           ((bVar4 = anon_unknown_2::IsEnabledByExtension(_,capability), bVar4 ||
            (bVar4 = anon_unknown_2::IsEnabledByCapabilityOpenCL_2_0(_,capability), bVar4))))
        goto LAB_00192255;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
        std::operator<<((ostream *)&local_208,"Capability ");
        CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
        operator()[abi_cxx11_(&local_248,&capability_str);
        std::operator<<((ostream *)&local_208,(string *)&local_248);
        pcVar6 = " is not allowed by OpenCL 2.0/2.1 ";
      }
    }
    std::operator<<((ostream *)&local_208,pcVar6);
    std::operator<<((ostream *)&local_208,(string *)&opencl_profile);
    std::operator<<((ostream *)&local_208," Profile specification");
    pcVar6 = " (or requires extension or capability)";
  }
  std::operator<<((ostream *)&local_208,pcVar6);
  std::__cxx11::string::_M_dispose();
  DiagnosticStream::~DiagnosticStream(&local_208);
  sVar5 = local_208.error_;
LAB_00192255:
  std::__cxx11::string::_M_dispose();
  return sVar5;
}

Assistant:

spv_result_t CapabilityPass(ValidationState_t& _, const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpCapability) return SPV_SUCCESS;

  assert(inst->operands().size() == 1);

  const spv_parsed_operand_t& operand = inst->operand(0);

  assert(operand.num_words == 1);
  assert(operand.offset < inst->words().size());

  const uint32_t capability = inst->word(operand.offset);
  const auto capability_str = [&_, capability]() {
    spv_operand_desc desc = nullptr;
    if (_.grammar().lookupOperand(SPV_OPERAND_TYPE_CAPABILITY, capability,
                                  &desc) != SPV_SUCCESS ||
        !desc) {
      return std::string("Unknown");
    }
    return std::string(desc->name);
  };

  const auto env = _.context()->target_env;
  const bool opencl_embedded = env == SPV_ENV_OPENCL_EMBEDDED_1_2 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_0 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_1 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_2;
  const std::string opencl_profile = opencl_embedded ? "Embedded" : "Full";
  if (env == SPV_ENV_VULKAN_1_0) {
    if (!IsSupportGuaranteedVulkan_1_0(capability) &&
        !IsSupportOptionalVulkan_1_0(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.0 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_VULKAN_1_1) {
    if (!IsSupportGuaranteedVulkan_1_1(capability) &&
        !IsSupportOptionalVulkan_1_1(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.1 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_VULKAN_1_2) {
    if (!IsSupportGuaranteedVulkan_1_2(capability) &&
        !IsSupportOptionalVulkan_1_2(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.2 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_OPENCL_1_2 || env == SPV_ENV_OPENCL_EMBEDDED_1_2) {
    if (!IsSupportGuaranteedOpenCL_1_2(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_1_2(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 1.2 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  } else if (env == SPV_ENV_OPENCL_2_0 || env == SPV_ENV_OPENCL_EMBEDDED_2_0 ||
             env == SPV_ENV_OPENCL_2_1 || env == SPV_ENV_OPENCL_EMBEDDED_2_1) {
    if (!IsSupportGuaranteedOpenCL_2_0(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_2_0(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 2.0/2.1 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  } else if (env == SPV_ENV_OPENCL_2_2 || env == SPV_ENV_OPENCL_EMBEDDED_2_2) {
    if (!IsSupportGuaranteedOpenCL_2_2(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_2_0(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 2.2 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  }

  return SPV_SUCCESS;
}